

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  UnknownField field;
  
  field.type_ = 3;
  field.number_ = number;
  field.data_.group_ = (UnknownFieldSet *)operator_new(0x20);
  ((field.data_.group_)->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&((field.data_.group_)->fields_).
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((field.data_.group_)->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &((field.data_.group_)->fields_).
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(&this->fields_,&field);
  return (string *)field.data_.varint_;
}

Assistant:

std::string* UnknownFieldSet::AddLengthDelimited(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_LENGTH_DELIMITED);
  field.data_.length_delimited_.string_value = new std::string;
  fields_.push_back(field);
  return field.data_.length_delimited_.string_value;
}